

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Comp::reset(V2Comp *this)

{
  int local_14;
  int i;
  V2Comp *this_local;
  
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    this->peakval[local_14] = 0.0;
    this->rmsval[local_14] = 0.0;
    this->curgain[local_14] = 1.0;
  }
  memset(this->rmsbuf,0,0x10000);
  this->rmscnt = 0;
  return;
}

Assistant:

void reset()
    {
        for (int i=0; i < 2; i++)
        {
            peakval[i] = 0.0f;
            rmsval[i] = 0.0f;
            curgain[i] = 1.0f;
        }
        memset(rmsbuf, 0, sizeof(rmsbuf));
        rmscnt = 0;
    }